

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_max_min(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bitset_t *pbVar7;
  long lVar8;
  long lVar9;
  bitset_t *pbVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong auStack_1b0 [5];
  bitset_t *pbStack_188;
  bitset_t *pbStack_180;
  code *pcStack_178;
  bitset_t *pbStack_168;
  undefined8 uStack_160;
  bitset_t *pbStack_158;
  code *pcStack_150;
  bitset_t *pbStack_140;
  bitset_t *pbStack_138;
  bitset_t *pbStack_130;
  ulong uStack_128;
  ulong uStack_120;
  bitset_t *pbStack_118;
  code *pcStack_110;
  bitset_t *pbStack_108;
  long lStack_100;
  ulong uStack_f8;
  bitset_t *pbStack_f0;
  code *pcStack_e8;
  bitset_t *pbStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  bitset_t *pbStack_c0;
  long lStack_b8;
  code *pcStack_b0;
  size_t sStack_a8;
  long lStack_a0;
  long lStack_98;
  bitset_t *pbStack_90;
  code *pcStack_88;
  size_t sStack_80;
  bitset_t *pbStack_78;
  ulong uStack_70;
  
  uVar11 = 300;
  pbVar3 = bitset_create();
  while( true ) {
    uVar19 = uVar11 >> 6;
    if ((uVar19 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar19 + 1), _Var2)) {
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar11 & 0x3f);
    }
    sVar4 = bitset_minimum(pbVar3);
    if (sVar4 != 300) break;
    sVar4 = bitset_maximum(pbVar3);
    if (uVar11 != sVar4) {
      test_max_min_cold_2();
      break;
    }
    uVar11 = uVar11 + 3;
    if (uVar11 == 3000) {
      bitset_free(pbVar3);
      return;
    }
  }
  test_max_min_cold_1();
  sVar4 = 0;
  while( true ) {
    uVar11 = 300;
    pbVar3 = bitset_create();
    do {
      uVar19 = uVar11 >> 6;
      if ((uVar19 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar19 + 1), _Var2)) {
        pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar11 & 0x3f);
      }
      uVar11 = uVar11 + 3;
    } while (uVar11 != 15000);
    sVar5 = bitset_count(pbVar3);
    bitset_shift_left(pbVar3,sVar4);
    sVar6 = bitset_count(pbVar3);
    if (sVar6 != sVar5) break;
    lVar8 = 300;
    do {
      uVar11 = sVar4 + lVar8 >> 6;
      if ((pbVar3->arraysize <= uVar11) ||
         ((pbVar3->array[uVar11] >> (sVar4 + lVar8 & 0x3f) & 1) == 0)) {
        test_shift_left_cold_2();
        goto LAB_00101cd8;
      }
      lVar8 = lVar8 + 3;
    } while (lVar8 != 15000);
    bitset_free(pbVar3);
    sVar4 = sVar4 + 1;
    if (sVar4 == 0x100) {
      return;
    }
  }
LAB_00101cd8:
  test_shift_left_cold_1();
  pbVar3 = bitset_create();
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 2;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array & 0xfffffffffffffffd;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array & 0xfffffffffffffbff;
  }
  if ((pbVar3->arraysize != 0) || (_Var2 = bitset_grow(pbVar3,1), _Var2)) {
    *pbVar3->array = *pbVar3->array | 0x400;
  }
  if ((pbVar3->arraysize == 0) || (((uint)*pbVar3->array >> 10 & 1) == 0)) {
    test_set_to_val_cold_2();
  }
  else if ((*pbVar3->array & 2) == 0) {
    bitset_free(pbVar3);
    return;
  }
  test_set_to_val_cold_1();
  lVar8 = 0;
  lVar17 = 0;
  sStack_80 = 0;
  pbStack_78 = pbVar3;
  uStack_70 = uVar19;
  do {
    lVar12 = 300;
    pcStack_88 = (code *)0x101db3;
    pbVar3 = bitset_create();
    do {
      uVar11 = (ulong)(lVar17 + lVar12) >> 6;
      if (uVar11 < pbVar3->arraysize) {
LAB_00101dd9:
        pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)(lVar17 + lVar12) & 0x3f);
      }
      else {
        pcStack_88 = (code *)0x101dd5;
        _Var2 = bitset_grow(pbVar3,uVar11 + 1);
        if (_Var2) goto LAB_00101dd9;
      }
      lVar12 = lVar12 + 3;
    } while (lVar12 != 0x3bc4);
    pcStack_88 = (code *)0x101dff;
    sVar5 = bitset_count(pbVar3);
    sVar4 = sStack_80;
    pcStack_88 = (code *)0x101e11;
    bitset_shift_right(pbVar3,sStack_80);
    pcStack_88 = (code *)0x101e19;
    sVar6 = bitset_count(pbVar3);
    if (sVar6 != sVar5) {
LAB_00101e85:
      pcStack_88 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_a8 = sVar4;
      pcStack_b0 = (code *)0x101e98;
      lStack_a0 = lVar8;
      lStack_98 = lVar17;
      pbStack_90 = pbVar3;
      pcStack_88 = (code *)sVar5;
      pbVar3 = bitset_create();
      lVar8 = 0;
      pcStack_b0 = (code *)0x101ea3;
      pbVar7 = bitset_create();
      uVar11 = 0;
      break;
    }
    lVar9 = 300;
    do {
      uVar11 = (ulong)(lVar8 + lVar9) >> 6;
      if ((pbVar3->arraysize <= uVar11) ||
         ((pbVar3->array[uVar11] >> (lVar8 + lVar9 & 0x3fU) & 1) == 0)) {
        pcStack_88 = (code *)0x101e85;
        test_shift_right_cold_2();
        goto LAB_00101e85;
      }
      lVar9 = lVar9 + 3;
    } while (lVar9 != 0x3bc4);
    pcStack_88 = (code *)0x101e59;
    bitset_free(pbVar3);
    sStack_80 = sVar4 + 1;
    lVar17 = lVar17 + 3;
    lVar8 = lVar8 + 2;
    if (sStack_80 == 0x100) {
      return;
    }
  } while( true );
  while( true ) {
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + 2;
    if (uVar11 == 1000) break;
    uVar19 = uVar11 >> 5;
    if (uVar19 < pbVar3->arraysize) {
LAB_00101ec6:
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)lVar8 & 0x3e);
    }
    else {
      pcStack_b0 = (code *)0x101ec2;
      _Var2 = bitset_grow(pbVar3,uVar19 + 1);
      if (_Var2) goto LAB_00101ec6;
    }
    if (uVar19 < pbVar7->arraysize) {
LAB_00101ef1:
      pbVar7->array[uVar19] = pbVar7->array[uVar19] | 2L << ((byte)lVar8 & 0x3e);
    }
    else {
      pcStack_b0 = (code *)0x101eed;
      _Var2 = bitset_grow(pbVar7,uVar19 + 1);
      if (_Var2) goto LAB_00101ef1;
    }
  }
  pcStack_b0 = (code *)0x101f21;
  bitset_inplace_symmetric_difference(pbVar3,pbVar7);
  pcStack_b0 = (code *)0x101f29;
  sVar4 = bitset_count(pbVar3);
  if (sVar4 == 2000) {
    pcStack_b0 = (code *)0x101f40;
    bitset_inplace_symmetric_difference(pbVar3,pbVar7);
    pcStack_b0 = (code *)0x101f48;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102002;
    pcStack_b0 = (code *)0x101f5f;
    bitset_inplace_difference(pbVar3,pbVar7);
    pcStack_b0 = (code *)0x101f67;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102007;
    pcStack_b0 = (code *)0x101f7e;
    bitset_inplace_union(pbVar3,pbVar7);
    pcStack_b0 = (code *)0x101f86;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 2000) goto LAB_0010200c;
    pcStack_b0 = (code *)0x101f99;
    bitset_inplace_intersection(pbVar3,pbVar7);
    pcStack_b0 = (code *)0x101fa1;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 1000) goto LAB_00102011;
    pcStack_b0 = (code *)0x101fb4;
    bitset_inplace_difference(pbVar3,pbVar7);
    pcStack_b0 = (code *)0x101fbc;
    sVar4 = bitset_count(pbVar3);
    if (sVar4 != 0) goto LAB_00102016;
    pcStack_b0 = (code *)0x101fcc;
    bitset_inplace_union(pbVar3,pbVar7);
    pcStack_b0 = (code *)0x101fd7;
    bitset_inplace_difference(pbVar7,pbVar3);
    pcStack_b0 = (code *)0x101fdf;
    sVar4 = bitset_count(pbVar7);
    if (sVar4 == 0) {
      pcStack_b0 = (code *)0x101fec;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_b0 = (code *)0x102002;
    test_union_intersection_cold_1();
LAB_00102002:
    pcStack_b0 = (code *)0x102007;
    test_union_intersection_cold_2();
LAB_00102007:
    pcStack_b0 = (code *)0x10200c;
    test_union_intersection_cold_3();
LAB_0010200c:
    pcStack_b0 = (code *)0x102011;
    test_union_intersection_cold_4();
LAB_00102011:
    pcStack_b0 = (code *)0x102016;
    test_union_intersection_cold_5();
LAB_00102016:
    pcStack_b0 = (code *)0x10201b;
    test_union_intersection_cold_6();
  }
  pcStack_b0 = test_counts;
  test_union_intersection_cold_7();
  pcStack_e8 = (code *)0x102030;
  pbStack_d8 = pbVar3;
  uStack_d0 = uVar11;
  uStack_c8 = uVar19;
  pbStack_c0 = pbVar7;
  lStack_b8 = lVar8;
  pcStack_b0 = (code *)lVar12;
  pbVar3 = bitset_create();
  lVar8 = 0;
  pcStack_e8 = (code *)0x10203b;
  pbVar7 = bitset_create();
  uVar19 = 0;
  uVar11 = 0;
  do {
    uVar13 = uVar11 >> 5;
    if (uVar13 < pbVar3->arraysize) {
LAB_00102061:
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)lVar8 & 0x3e);
    }
    else {
      pcStack_e8 = (code *)0x10205d;
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
      if (_Var2) goto LAB_00102061;
    }
    uVar13 = uVar19 >> 6;
    if (uVar13 < pbVar7->arraysize) {
LAB_00102093:
      pbVar7->array[uVar13] = pbVar7->array[uVar13] | 1L << ((byte)uVar19 & 0x3f);
    }
    else {
      pcStack_e8 = (code *)0x10208f;
      _Var2 = bitset_grow(pbVar7,uVar13 + 1);
      if (_Var2) goto LAB_00102093;
    }
    uVar11 = uVar11 + 1;
    uVar19 = uVar19 + 3;
    lVar8 = lVar8 + 2;
  } while (uVar11 != 1000);
  pcStack_e8 = (code *)0x1020c4;
  sVar4 = bitset_intersection_count(pbVar3,pbVar7);
  if (sVar4 == 0x14e) {
    pcStack_e8 = (code *)0x1020d7;
    sVar4 = bitset_union_count(pbVar3,pbVar7);
    if (sVar4 == 0x682) {
      pcStack_e8 = (code *)0x1020e7;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_e8 = (code *)0x102102;
    test_counts_cold_1();
  }
  pcStack_e8 = test_disjoint;
  test_counts_cold_2();
  pcStack_110 = (code *)0x102115;
  pbStack_108 = pbVar3;
  lStack_100 = lVar8;
  uStack_f8 = uVar11;
  pbStack_f0 = pbVar7;
  pcStack_e8 = (code *)uVar19;
  pbVar3 = bitset_create();
  uVar11 = 0;
  pcStack_110 = (code *)0x102120;
  pbVar7 = bitset_create();
  do {
    uVar19 = uVar11 >> 6;
    if ((uVar11 & 1) == 0) {
      uVar13 = 0x3e;
      pbVar10 = pbVar3;
      if (uVar19 < pbVar3->arraysize) goto LAB_00102176;
      pcStack_110 = (code *)0x10215e;
      _Var2 = bitset_grow(pbVar3,uVar19 + 1);
LAB_00102172:
      if (_Var2 != false) goto LAB_00102176;
    }
    else {
      uVar13 = 0x3f;
      pbVar10 = pbVar7;
      if (pbVar7->arraysize <= uVar19) {
        pcStack_110 = (code *)0x10216f;
        _Var2 = bitset_grow(pbVar7,uVar19 + 1);
        goto LAB_00102172;
      }
LAB_00102176:
      uVar18 = (uint)uVar13 & (uint)uVar11;
      uVar13 = (ulong)uVar18;
      pbVar10->array[uVar19] = pbVar10->array[uVar19] | 1L << (sbyte)uVar18;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 1000);
  pcStack_110 = (code *)0x1021a2;
  _Var2 = bitsets_disjoint(pbVar3,pbVar7);
  if (_Var2) {
    uVar13 = 0x20000000000000;
    if (pbVar3->arraysize < 8) {
      pcStack_110 = (code *)0x1021c4;
      _Var2 = bitset_grow(pbVar3,8);
      if (_Var2) goto LAB_001021c8;
    }
    else {
LAB_001021c8:
      pbVar3->array[7] = pbVar3->array[7] | 0x20000000000000;
    }
    if (pbVar7->arraysize < 8) {
      pcStack_110 = (code *)0x1021e3;
      _Var2 = bitset_grow(pbVar7,8);
      if (_Var2) goto LAB_001021e7;
    }
    else {
LAB_001021e7:
      pbVar7->array[7] = pbVar7->array[7] | 0x20000000000000;
    }
    pcStack_110 = (code *)0x1021f9;
    _Var2 = bitsets_disjoint(pbVar3,pbVar7);
    if (!_Var2) {
      pcStack_110 = (code *)0x102205;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_110 = (code *)0x10221b;
    test_disjoint_cold_1();
  }
  pcStack_110 = test_intersects;
  test_disjoint_cold_2();
  pbStack_138 = (bitset_t *)0x10222e;
  pbStack_130 = pbVar3;
  uStack_128 = uVar11;
  uStack_120 = uVar19;
  pbStack_118 = pbVar7;
  pcStack_110 = (code *)uVar13;
  pbVar3 = bitset_create();
  pbStack_138 = (bitset_t *)0x102236;
  pbVar7 = bitset_create();
  pbStack_138 = (bitset_t *)0x102241;
  _Var2 = bitset_empty(pbVar3);
  if (_Var2) {
    uVar11 = 0;
    do {
      uVar19 = uVar11 >> 6;
      if ((uVar11 & 1) == 0) {
        uVar13 = 0x3e;
        pbVar10 = pbVar3;
        if (uVar19 < pbVar3->arraysize) goto LAB_0010229f;
        pbStack_138 = (bitset_t *)0x102287;
        _Var2 = bitset_grow(pbVar3,uVar19 + 1);
LAB_0010229b:
        if (_Var2 != false) goto LAB_0010229f;
      }
      else {
        uVar13 = 0x3f;
        pbVar10 = pbVar7;
        if (pbVar7->arraysize <= uVar19) {
          pbStack_138 = (bitset_t *)0x102298;
          _Var2 = bitset_grow(pbVar7,uVar19 + 1);
          goto LAB_0010229b;
        }
LAB_0010229f:
        uVar18 = (uint)uVar13 & (uint)uVar11;
        uVar13 = (ulong)uVar18;
        pbVar10->array[uVar19] = pbVar10->array[uVar19] | 1L << (sbyte)uVar18;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 1000);
    pbStack_138 = (bitset_t *)0x1022cb;
    _Var2 = bitsets_intersect(pbVar3,pbVar7);
    if (_Var2) goto LAB_00102344;
    uVar13 = 0x20000000000;
    if (pbVar3->arraysize < 0x10) {
      pbStack_138 = (bitset_t *)0x1022ed;
      _Var2 = bitset_grow(pbVar3,0x10);
      if (_Var2) goto LAB_001022f1;
    }
    else {
LAB_001022f1:
      pbVar3->array[0xf] = pbVar3->array[0xf] | 0x20000000000;
    }
    if (pbVar7->arraysize < 0x10) {
      pbStack_138 = (bitset_t *)0x10230c;
      _Var2 = bitset_grow(pbVar7,0x10);
      if (_Var2) goto LAB_00102310;
    }
    else {
LAB_00102310:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pbStack_138 = (bitset_t *)0x102322;
    _Var2 = bitsets_intersect(pbVar3,pbVar7);
    if (_Var2) {
      pbStack_138 = (bitset_t *)0x10232e;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pbStack_138 = (bitset_t *)0x102344;
    test_intersects_cold_1();
LAB_00102344:
    pbStack_138 = (bitset_t *)0x102349;
    test_intersects_cold_3();
  }
  pbStack_138 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_150 = (code *)0x10235c;
  pbStack_140 = pbVar3;
  pbStack_138 = pbVar7;
  pbVar3 = bitset_create_with_capacity(10);
  pcStack_150 = (code *)0x102369;
  pbVar7 = bitset_create_with_capacity(5);
  if (pbVar3->arraysize == 0) {
    pcStack_150 = (code *)0x102380;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_00102384;
  }
  else {
LAB_00102384:
    *pbVar3->array = *pbVar3->array | 2;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_150 = (code *)0x10239f;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023a3;
  }
  else {
LAB_001023a3:
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_150 = (code *)0x1023be;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023c2;
  }
  else {
LAB_001023c2:
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_150 = (code *)0x1023dd;
    _Var2 = bitset_grow(pbVar7,1);
    if (_Var2) goto LAB_001023e1;
  }
  else {
LAB_001023e1:
    *pbVar7->array = *pbVar7->array | 2;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_150 = (code *)0x1023fc;
    _Var2 = bitset_grow(pbVar7,1);
    if (_Var2) goto LAB_00102400;
  }
  else {
LAB_00102400:
    *pbVar7->array = *pbVar7->array | 0x10;
  }
  pcStack_150 = (code *)0x102412;
  _Var2 = bitset_contains_all(pbVar3,pbVar7);
  if (_Var2) {
    pcStack_150 = (code *)0x102421;
    _Var2 = bitset_contains_all(pbVar7,pbVar3);
    if (!_Var2) {
      pcStack_150 = (code *)0x10242d;
      bitset_free(pbVar3);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_150 = (code *)0x102441;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_150 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_178 = (code *)0x102453;
  pbStack_168 = pbVar3;
  uStack_160 = 1000;
  pbStack_158 = pbVar7;
  pcStack_150 = (code *)uVar13;
  pbVar3 = bitset_create();
  uVar11 = 0;
  pcStack_178 = (code *)0x10245e;
  pbVar7 = bitset_create();
  do {
    uVar19 = uVar11 >> 6;
    if (uVar19 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar11 & 0x3f);
    }
    else {
      pcStack_178 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar19 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar11 & 1) == 0) {
      if (pbVar7->arraysize <= uVar19) {
        pcStack_178 = (code *)0x1024aa;
        _Var2 = bitset_grow(pbVar7,uVar19 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      pbVar7->array[uVar19] = pbVar7->array[uVar19] | 1L << ((byte)uVar11 & 0x3e);
    }
LAB_001024c3:
    uVar11 = uVar11 + 1;
  } while (uVar11 != 1000);
  pcStack_178 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,pbVar7);
  if (_Var2) {
    pcStack_178 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(pbVar7,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (pbVar7->arraysize < 0x10) {
      pcStack_178 = (code *)0x102501;
      _Var2 = bitset_grow(pbVar7,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pcStack_178 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,pbVar7);
    if (!_Var2) {
      pcStack_178 = (code *)0x102530;
      _Var2 = bitset_contains_all(pbVar7,pbVar3);
      if (!_Var2) {
        pcStack_178 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(pbVar7);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_178 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_178 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_178 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_178 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar19 = 0;
  pbStack_188 = pbVar3;
  pbStack_180 = pbVar7;
  pcStack_178 = (code *)uVar11;
  pbVar3 = bitset_create();
  do {
    uVar11 = uVar19 >> 6;
    if (uVar11 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar11] = pbVar3->array[uVar11] | 1L << ((byte)uVar19 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar11 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 100);
  uVar11 = 0x3e6;
  do {
    uVar11 = uVar11 + 2;
    uVar19 = uVar11 >> 6;
    if (uVar19 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar11 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar19 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar11 < 0x44a);
  uVar11 = pbVar3->arraysize;
  if (uVar11 != 0) {
    puVar1 = pbVar3->array;
    uVar13 = 0;
    uVar19 = 0;
    lVar8 = 0;
    do {
      uVar16 = (puVar1[uVar13] >> ((byte)uVar19 & 0x3f)) << ((byte)uVar19 & 0x3f);
      uVar19 = uVar19 & 0xffffffffffffffc0;
      uVar14 = 0;
      do {
        while (uVar16 == 0) {
          uVar13 = uVar13 + 1;
          if (uVar13 == uVar11) {
            lVar17 = lVar8;
            if (uVar14 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar19 = uVar19 + 0x40;
          uVar16 = puVar1[uVar13];
          if (2 < uVar14) goto LAB_0010265a;
        }
        uVar15 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        auStack_1b0[uVar14 + 1] = uVar15 | uVar19;
        uVar14 = uVar14 + 1;
        uVar16 = uVar16 & uVar16 - 1;
      } while (uVar14 != 3);
      uVar14 = 3;
LAB_0010265a:
      lVar17 = lVar8 + uVar14;
      uVar19 = lVar8 * 2 + 800;
      uVar13 = 0;
      do {
        uVar15 = lVar8 + uVar13;
        if (99 < lVar8 + uVar13) {
          uVar15 = uVar19;
        }
        if (auStack_1b0[uVar13 + 1] != uVar15) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar13 = uVar13 + 1;
        uVar19 = uVar19 + 2;
      } while (uVar14 != uVar13);
      uVar19 = auStack_1b0[uVar14] + 1;
      uVar13 = uVar19 >> 6;
      lVar8 = lVar17;
    } while (uVar13 < uVar11);
LAB_001026ac:
    if (lVar17 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar11 = 0;
  pbVar3 = bitset_create();
  do {
    uVar19 = uVar11 >> 6;
    if ((uVar19 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar19 + 1), _Var2)) {
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar11 & 0x3f);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  uVar11 = 0x3e6;
  do {
    uVar11 = uVar11 + 2;
    uVar19 = uVar11 >> 6;
    if ((uVar19 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar19 + 1), _Var2)) {
      pbVar3->array[uVar19] = pbVar3->array[uVar19] | 1L << ((byte)uVar11 & 0x3e);
    }
  } while (uVar11 < 0x44a);
  uVar11 = pbVar3->arraysize;
  if (uVar11 != 0) {
    uVar14 = 0;
    uVar13 = 0;
    uVar19 = 0;
    do {
      uVar15 = pbVar3->array[uVar14] >> ((byte)uVar19 & 0x3f);
      if (uVar15 == 0) {
        lVar8 = uVar14 * -0x40;
        do {
          uVar14 = uVar14 + 1;
          if (uVar11 == uVar14) goto LAB_001027db;
          uVar19 = pbVar3->array[uVar14];
          lVar8 = lVar8 + -0x40;
        } while (uVar19 == 0);
        lVar17 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        uVar19 = lVar17 - lVar8;
      }
      else {
        lVar8 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar19 = uVar19 + lVar8;
      }
      uVar14 = uVar13 * 2 + 800;
      if (uVar13 < 100) {
        uVar14 = uVar13;
      }
      if (uVar19 != uVar14) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar13 = uVar13 + 1;
      uVar19 = uVar19 + 1;
      uVar14 = uVar19 >> 6;
    } while (uVar14 < uVar11);
LAB_001027db:
    if (uVar13 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_max_min() {
  bitset_t *b = bitset_create();
  for (size_t k = 100; k < 1000; ++k) {
    bitset_set(b, 3 * k);
    TEST_ASSERT(bitset_minimum(b) == 3 * 100);
    TEST_ASSERT(bitset_maximum(b) == 3 * k);
  }
  bitset_free(b);
}